

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  InternalMetadataWithArena *this_00;
  Rep *pRVar1;
  void *pvVar2;
  FileOptions *from_00;
  SourceCodeInfo *from_01;
  void **ppvVar3;
  FileOptions *this_01;
  SourceCodeInfo *this_02;
  int iVar4;
  Arena *pAVar5;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_00680380;
  this_00 = &this->_internal_metadata_;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->dependency_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar4 = (from->dependency_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar1 = (from->dependency_).super_RepeatedPtrFieldBase.rep_;
    ppvVar3 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->dependency_).super_RepeatedPtrFieldBase,iVar4);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
              (&(this->dependency_).super_RepeatedPtrFieldBase,ppvVar3,pRVar1->elements,iVar4,
               ((this->dependency_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->dependency_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
    (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar1 = (this->dependency_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar4) {
      pRVar1->allocated_size = iVar4;
    }
  }
  (this->message_type_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar4 = (from->message_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar1 = (from->message_type_).super_RepeatedPtrFieldBase.rep_;
    ppvVar3 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->message_type_).super_RepeatedPtrFieldBase,iVar4);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
              (&(this->message_type_).super_RepeatedPtrFieldBase,ppvVar3,pRVar1->elements,iVar4,
               ((this->message_type_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
    (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar1 = (this->message_type_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar4) {
      pRVar1->allocated_size = iVar4;
    }
  }
  (this->enum_type_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar4 = (from->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar1 = (from->enum_type_).super_RepeatedPtrFieldBase.rep_;
    ppvVar3 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar4);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
              (&(this->enum_type_).super_RepeatedPtrFieldBase,ppvVar3,pRVar1->elements,iVar4,
               ((this->enum_type_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
    (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar1 = (this->enum_type_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar4) {
      pRVar1->allocated_size = iVar4;
    }
  }
  (this->service_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->service_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar4 = (from->service_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar1 = (from->service_).super_RepeatedPtrFieldBase.rep_;
    ppvVar3 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->service_).super_RepeatedPtrFieldBase,iVar4);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::TypeHandler>
              (&(this->service_).super_RepeatedPtrFieldBase,ppvVar3,pRVar1->elements,iVar4,
               ((this->service_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->service_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->service_).super_RepeatedPtrFieldBase.current_size_;
    (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar1 = (this->service_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar4) {
      pRVar1->allocated_size = iVar4;
    }
  }
  (this->extension_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar4 = (from->extension_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar1 = (from->extension_).super_RepeatedPtrFieldBase.rep_;
    ppvVar3 = internal::RepeatedPtrFieldBase::InternalExtend
                        (&(this->extension_).super_RepeatedPtrFieldBase,iVar4);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
              (&(this->extension_).super_RepeatedPtrFieldBase,ppvVar3,pRVar1->elements,iVar4,
               ((this->extension_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->extension_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->extension_).super_RepeatedPtrFieldBase.current_size_;
    (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar1 = (this->extension_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar4) {
      pRVar1->allocated_size = iVar4;
    }
  }
  (this->public_dependency_).current_size_ = 0;
  (this->public_dependency_).total_size_ = 0;
  (this->public_dependency_).arena_or_elements_ = (void *)0x0;
  iVar4 = (from->public_dependency_).current_size_;
  if (iVar4 != 0) {
    RepeatedField<int>::Reserve(&this->public_dependency_,iVar4);
    (this->public_dependency_).current_size_ =
         (this->public_dependency_).current_size_ + (from->public_dependency_).current_size_;
    memcpy((this->public_dependency_).arena_or_elements_,
           (from->public_dependency_).arena_or_elements_,
           (long)(from->public_dependency_).current_size_ << 2);
  }
  (this->weak_dependency_).current_size_ = 0;
  (this->weak_dependency_).total_size_ = 0;
  (this->weak_dependency_).arena_or_elements_ = (void *)0x0;
  iVar4 = (from->weak_dependency_).current_size_;
  if (iVar4 != 0) {
    RepeatedField<int>::Reserve(&this->weak_dependency_,iVar4);
    (this->weak_dependency_).current_size_ =
         (this->weak_dependency_).current_size_ + (from->weak_dependency_).current_size_;
    memcpy((this->weak_dependency_).arena_or_elements_,(from->weak_dependency_).arena_or_elements_,
           (long)(from->weak_dependency_).current_size_ << 2);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    pAVar5 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->name_,pAVar5,(from->name_).ptr_);
  }
  (this->package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 2) != 0) {
    pAVar5 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->package_,pAVar5,(from->package_).ptr_);
  }
  (this->syntax_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 4) != 0) {
    pAVar5 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->syntax_,pAVar5,(from->syntax_).ptr_);
  }
  if (((from->_has_bits_).has_bits_[0] & 8) == 0) {
    this_01 = (FileOptions *)0x0;
  }
  else {
    from_00 = from->options_;
    this_01 = (FileOptions *)operator_new(0xa8);
    FileOptions::FileOptions(this_01,from_00);
  }
  this->options_ = this_01;
  if (((from->_has_bits_).has_bits_[0] & 0x10) == 0) {
    this_02 = (SourceCodeInfo *)0x0;
  }
  else {
    from_01 = from->source_code_info_;
    this_02 = (SourceCodeInfo *)operator_new(0x30);
    SourceCodeInfo::SourceCodeInfo(this_02,from_01);
  }
  this->source_code_info_ = this_02;
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto(const FileDescriptorProto& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      dependency_(from.dependency_),
      message_type_(from.message_type_),
      enum_type_(from.enum_type_),
      service_(from.service_),
      extension_(from.extension_),
      public_dependency_(from.public_dependency_),
      weak_dependency_(from.weak_dependency_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_name()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArenaNoVirtual());
  }
  package_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_package()) {
    package_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_package(),
      GetArenaNoVirtual());
  }
  syntax_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_syntax()) {
    syntax_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_syntax(),
      GetArenaNoVirtual());
  }
  if (from._internal_has_options()) {
    options_ = new PROTOBUF_NAMESPACE_ID::FileOptions(*from.options_);
  } else {
    options_ = nullptr;
  }
  if (from._internal_has_source_code_info()) {
    source_code_info_ = new PROTOBUF_NAMESPACE_ID::SourceCodeInfo(*from.source_code_info_);
  } else {
    source_code_info_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileDescriptorProto)
}